

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_lua.c
# Opt level: O0

int l_sqlite3_step(lua_State *L)

{
  int iVar1;
  undefined8 *puVar2;
  Stmt *stmt;
  lua_State *L_local;
  
  puVar2 = (undefined8 *)checkudata(L,1);
  init_callback_usage(L,(DB *)*puVar2);
  iVar1 = sqlite3_step((sqlite3_stmt *)puVar2[1]);
  lua_pushnumber((double)iVar1,L);
  return 1;
}

Assistant:

FUNC( l_sqlite3_step )
{
  Stmt * stmt = checkstmt(L, 1);
  init_callback_usage(L, stmt->db);
  lua_pushnumber(L, sqlite3_step(stmt->stmt) );
  return 1;
}